

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O1

xmlRefPtr xmlAddRef(xmlValidCtxtPtr ctxt,xmlDocPtr doc,xmlChar *value,xmlAttrPtr attr)

{
  int iVar1;
  xmlHashTablePtr table;
  xmlRefPtr data;
  xmlChar *pxVar2;
  long lVar3;
  xmlListPtr l;
  char *pcVar4;
  xmlAttrPtr pxVar5;
  
  if (attr == (xmlAttrPtr)0x0 || (value == (xmlChar *)0x0 || doc == (xmlDocPtr)0x0)) {
    return (xmlRefPtr)0x0;
  }
  table = (xmlHashTablePtr)doc->refs;
  if (table == (xmlHashTablePtr)0x0) {
    table = xmlHashCreateDict(0,doc->dict);
    doc->refs = table;
  }
  if (table == (xmlHashTablePtr)0x0) {
    pcVar4 = "xmlAddRef: Table creation failed!\n";
LAB_00190ffa:
    xmlVErrMemory(ctxt,pcVar4);
    return (xmlRefPtr)0x0;
  }
  data = (xmlRefPtr)(*xmlMalloc)(0x28);
  if (data == (xmlRefPtr)0x0) {
    pcVar4 = "malloc failed";
    goto LAB_00190ffa;
  }
  pxVar2 = xmlStrdup(value);
  data->value = pxVar2;
  if (((ctxt == (xmlValidCtxtPtr)0x0) || ((ctxt->flags & 2) == 0)) ||
     (*(int *)((long)ctxt->userData + 0x2b0) != 5)) {
    pxVar2 = (xmlChar *)0x0;
    pxVar5 = attr;
  }
  else {
    pxVar2 = xmlStrdup(attr->name);
    pxVar5 = (xmlAttrPtr)0x0;
  }
  data->name = pxVar2;
  data->attr = pxVar5;
  lVar3 = xmlGetLineNo(attr->parent);
  data->lineno = (int)lVar3;
  l = (xmlListPtr)xmlHashLookup(table,value);
  if (l == (xmlListPtr)0x0) {
    l = xmlListCreate(xmlFreeRef,xmlDummyCompare);
    if (l != (xmlListPtr)0x0) {
      iVar1 = xmlHashAddEntry(table,value,l);
      if (iVar1 < 0) {
        xmlListDelete(l);
        xmlErrValid((xmlValidCtxtPtr)0x0,XML_ERR_INTERNAL_ERROR,
                    "xmlAddRef: Reference list insertion failed!\n",(char *)0x0);
        goto LAB_001910b2;
      }
      goto LAB_00190fd7;
    }
    pcVar4 = "xmlAddRef: Reference list creation failed!\n";
  }
  else {
LAB_00190fd7:
    iVar1 = xmlListAppend(l,data);
    if (iVar1 == 0) {
      return data;
    }
    pcVar4 = "xmlAddRef: Reference list insertion failed!\n";
  }
  __xmlRaiseError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,(void *)0x0,
                  (void *)0x0,0x17,1,XML_ERR_ERROR,(char *)0x0,0,(char *)0x0,(char *)0x0,(char *)0x0
                  ,0,0,"%s",pcVar4);
LAB_001910b2:
  if (data->value != (xmlChar *)0x0) {
    (*xmlFree)(data->value);
  }
  if (data->name != (xmlChar *)0x0) {
    (*xmlFree)(data->name);
  }
  (*xmlFree)(data);
  return (xmlRefPtr)0x0;
}

Assistant:

xmlRefPtr
xmlAddRef(xmlValidCtxtPtr ctxt, xmlDocPtr doc, const xmlChar *value,
    xmlAttrPtr attr) {
    xmlRefPtr ret;
    xmlRefTablePtr table;
    xmlListPtr ref_list;

    if (doc == NULL) {
        return(NULL);
    }
    if (value == NULL) {
        return(NULL);
    }
    if (attr == NULL) {
        return(NULL);
    }

    /*
     * Create the Ref table if needed.
     */
    table = (xmlRefTablePtr) doc->refs;
    if (table == NULL) {
        doc->refs = table = xmlHashCreateDict(0, doc->dict);
    }
    if (table == NULL) {
	xmlVErrMemory(ctxt,
            "xmlAddRef: Table creation failed!\n");
        return(NULL);
    }

    ret = (xmlRefPtr) xmlMalloc(sizeof(xmlRef));
    if (ret == NULL) {
	xmlVErrMemory(ctxt, "malloc failed");
        return(NULL);
    }

    /*
     * fill the structure.
     */
    ret->value = xmlStrdup(value);
    if (xmlIsStreaming(ctxt)) {
	/*
	 * Operating in streaming mode, attr is gonna disappear
	 */
	ret->name = xmlStrdup(attr->name);
	ret->attr = NULL;
    } else {
	ret->name = NULL;
	ret->attr = attr;
    }
    ret->lineno = xmlGetLineNo(attr->parent);

    /* To add a reference :-
     * References are maintained as a list of references,
     * Lookup the entry, if no entry create new nodelist
     * Add the owning node to the NodeList
     * Return the ref
     */

    if (NULL == (ref_list = xmlHashLookup(table, value))) {
        if (NULL == (ref_list = xmlListCreate(xmlFreeRef, xmlDummyCompare))) {
	    xmlErrValid(NULL, XML_ERR_INTERNAL_ERROR,
		    "xmlAddRef: Reference list creation failed!\n",
		    NULL);
	    goto failed;
        }
        if (xmlHashAddEntry(table, value, ref_list) < 0) {
            xmlListDelete(ref_list);
	    xmlErrValid(NULL, XML_ERR_INTERNAL_ERROR,
		    "xmlAddRef: Reference list insertion failed!\n",
		    NULL);
	    goto failed;
        }
    }
    if (xmlListAppend(ref_list, ret) != 0) {
	xmlErrValid(NULL, XML_ERR_INTERNAL_ERROR,
		    "xmlAddRef: Reference list insertion failed!\n",
		    NULL);
        goto failed;
    }
    return(ret);
failed:
    if (ret != NULL) {
        if (ret->value != NULL)
	    xmlFree((char *)ret->value);
        if (ret->name != NULL)
	    xmlFree((char *)ret->name);
        xmlFree(ret);
    }
    return(NULL);
}